

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O2

QString * __thiscall
QDnsLookupRunnable::decodeLabel<QLatin1String>
          (QString *__return_storage_ptr__,QDnsLookupRunnable *this,QLatin1String encodedLabel)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  QLatin1String encodedLabel_local;
  
  encodedLabel_local.m_data = (char *)encodedLabel.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  encodedLabel_local.m_size = (qsizetype)this;
  QLatin1String::toString((QString *)&local_40,&encodedLabel_local);
  qt_ACE_do(__return_storage_ptr__,&local_40,1,1,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString decodeLabel(T encodedLabel)
    {
        return qt_ACE_do(encodedLabel.toString(), NormalizeAce, ForbidLeadingDot);
    }